

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

size_t pugi::impl::(anonymous_namespace)::
       convert_buffer_output_generic<pugi::impl::(anonymous_namespace)::utf8_decoder,pugi::impl::(anonymous_namespace)::utf32_writer>
                 (uint32_t *param_1,undefined8 param_2,undefined8 param_3,byte param_4)

{
  uint32_t uVar1;
  value_type puVar2;
  value_type i;
  value_type end;
  uint32_t *local_40;
  
  puVar2 = anon_unknown_0::utf8_decoder::process<pugi::impl::(anonymous_namespace)::utf32_writer>
                     (param_2,param_3,param_1);
  local_40 = param_1;
  if ((param_4 & 1) != 0) {
    for (; local_40 != puVar2; local_40 = local_40 + 1) {
      uVar1 = anon_unknown_0::endian_swap(*local_40);
      *local_40 = uVar1;
    }
  }
  return ((long)puVar2 - (long)param_1 >> 2) << 2;
}

Assistant:

PUGI__FN size_t convert_buffer_output_generic(typename T::value_type dest, const char_t* data, size_t length, D, T, bool opt_swap)
	{
		PUGI__STATIC_ASSERT(sizeof(char_t) == sizeof(typename D::type));

		typename T::value_type end = D::process(reinterpret_cast<const typename D::type*>(data), length, dest, T());

		if (opt_swap)
		{
			for (typename T::value_type i = dest; i != end; ++i)
				*i = endian_swap(*i);
		}

		return static_cast<size_t>(end - dest) * sizeof(*dest);
	}